

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * __thiscall
vera::cone(Mesh *__return_storage_ptr__,vera *this,float radius,float _height,int _radiusSegments,
          int _heightSegments,int _capSegments,DrawMode _drawMode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  float in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined1 auVar14 [12];
  undefined4 in_XMM0_Dd;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float in_XMM2_Db;
  undefined1 auVar22 [12];
  float fVar24;
  undefined1 auVar23 [12];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar25;
  vec3 vert;
  vec2 tcoord;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_140;
  float fStack_13c;
  float local_138;
  uint local_134;
  uint local_130;
  float local_12c;
  int local_128;
  DrawMode local_124;
  float local_120;
  float local_11c;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_118;
  float local_114;
  long local_110;
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  vec3 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_58;
  float fStack_54;
  float local_50;
  undefined1 local_48 [16];
  undefined1 auVar18 [16];
  
  uVar10 = 0;
  local_f8 = radius;
  fStack_f4 = in_XMM0_Db;
  uStack_f0 = in_XMM0_Dc;
  uStack_ec = in_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  local_124 = TRIANGLE_STRIP;
  if (0xfffffffd < _capSegments - 6U) {
    local_124 = _capSegments;
  }
  __return_storage_ptr__->m_drawMode = local_124;
  iVar1 = (int)this;
  uVar3 = iVar1 + 1;
  local_128 = _heightSegments + 1;
  iVar4 = 1;
  if (1 < _radiusSegments) {
    iVar4 = _radiusSegments;
  }
  uVar8 = 0;
  local_11c = (float)(int)uVar3 + -1.0;
  local_120 = -6.2831855 / local_11c;
  local_108 = (float)(iVar4 + 1) + -1.0;
  fVar15 = _height * 0.5;
  local_48 = ZEXT416((uint)fVar15);
  local_c8 = -0.0;
  if (0 < _heightSegments) {
    local_c8 = (float)local_128 + -1.0;
  }
  fVar20 = _height / local_108;
  local_c8 = local_c8 + local_108;
  local_b8 = -fVar15;
  fStack_b0 = -0.0;
  fStack_ac = -0.0;
  fStack_b4 = -0.0;
  local_88._0_4_ = -1.0 - fVar15;
  local_110 = CONCAT44(local_110._4_4_,(float)iVar4);
  local_78 = ZEXT416((uint)ABS(0.0 - (float)iVar4));
  fStack_104 = in_XMM2_Db;
  uStack_100 = uVar10;
  do {
    iVar12 = (int)uVar8;
    if (-1 < iVar1) {
      fVar15 = (float)iVar12;
      fVar16 = (fVar15 / (float)local_110) * local_f8 + 0.0;
      fVar21 = fVar20 * fVar15 + local_b8;
      local_68 = ZEXT416((uint)(1.0 - fVar15 / local_c8));
      local_130 = -(uint)(0.0 <= fVar16 || local_f8 < fVar16);
      local_98._0_4_ = local_f8;
      if (fVar16 <= local_f8) {
        local_98._0_4_ = fVar16;
      }
      local_98._4_4_ = fStack_f4;
      uStack_90 = uStack_f0;
      uStack_8c = uStack_ec;
      local_a8._0_4_ = local_f8;
      if (local_f8 <= fVar16) {
        local_a8._0_4_ = fVar16;
      }
      local_a8._4_4_ = fStack_f4;
      uStack_a0 = uStack_f0;
      uStack_9c = uStack_ec;
      local_134 = -(uint)(fVar16 <= 0.0 || fVar16 < local_f8);
      uVar7 = 0;
      do {
        fVar15 = 0.0;
        if (1.1920929e-07 <= (float)local_78._0_4_) {
          if (0.0 <= local_f8) {
            fVar15 = (float)local_98._0_4_;
            uVar2 = local_130;
          }
          else {
            fVar15 = (float)local_a8._0_4_;
            uVar2 = local_134;
          }
          if ((uVar2 & 1) == 0) {
            fVar15 = 0.0;
          }
        }
        local_12c = (float)(int)uVar7;
        local_e8 = local_120 * local_12c;
        fVar16 = cosf(local_e8);
        local_140.x = fVar16 * fVar15;
        fStack_13c = fVar21;
        local_138 = sinf(local_e8);
        local_138 = local_138 * fVar15;
        local_118.x = local_12c / local_11c;
        local_114 = (float)local_68._0_4_;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_118);
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_140);
        if (iVar12 == 0) {
          local_140.x = cosf(local_e8);
          fStack_13c = fVar21;
          local_138 = sinf(local_e8);
        }
        fVar15 = fStack_13c * -0.0 + local_138;
        fVar16 = local_140.x * 0.0 + local_138 * -0.0;
        fVar24 = fStack_13c * 0.0 + -local_140.x;
        local_58.x = local_138 * fVar16 - fVar24 * (fStack_13c - (float)local_88._0_4_);
        aVar25.y = local_140.x * fVar24 - fVar15 * local_138;
        local_50 = fVar15 * (fStack_13c - (float)local_88._0_4_) - fVar16 * local_140.x;
        local_d8.field_1.y = aVar25.y;
        local_d8.field_0.x = local_58.x;
        fStack_54 = 1.0 / SQRT(aVar25.y * aVar25.y + local_58.x * local_58.x + local_50 * local_50);
        local_50 = local_50 * fStack_54;
        local_58.x = fStack_54 * local_58.x;
        fStack_54 = fStack_54 * aVar25.y;
        Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_58);
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    uVar8 = (ulong)(iVar12 + 1);
  } while (iVar12 != iVar4);
  if (local_124 == TRIANGLES) {
    iVar12 = 0;
    do {
      if (0 < iVar1) {
        uVar6 = iVar12 * uVar3;
        uVar8 = (ulong)this & 0xffffffff;
        uVar5 = (iVar12 + 1) * uVar3;
        do {
          if (iVar12 != 0) {
            Mesh::addIndex(__return_storage_ptr__,uVar6);
            Mesh::addIndex(__return_storage_ptr__,uVar6 + 1);
            Mesh::addIndex(__return_storage_ptr__,uVar5);
          }
          uVar6 = uVar6 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar6);
          Mesh::addIndex(__return_storage_ptr__,uVar5 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
          uVar5 = uVar5 + 1;
        } while (uVar7 != 0);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar4);
  }
  else {
    iVar12 = 0;
    do {
      if (-1 < iVar1) {
        uVar8 = (ulong)uVar3;
        uVar5 = iVar12 * uVar3;
        uVar6 = (iVar12 + 1) * uVar3;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          Mesh::addIndex(__return_storage_ptr__,uVar6);
          uVar6 = uVar6 + 1;
          uVar5 = uVar5 + 1;
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar4);
  }
  local_d8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_d8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_d8.field_2.z = 0.0;
  if (0 < _heightSegments) {
    local_110 = ((long)(__return_storage_ptr__->m_vertices).
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->m_vertices).
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    local_108 = local_108 / local_c8;
    local_e8 = ABS(0.0 - (float)_heightSegments);
    uStack_e4 = 0;
    uStack_e0 = 0;
    uStack_dc = 0;
    local_c8 = local_f8;
    fStack_c0 = fStack_f4;
    fStack_bc = fStack_104;
    local_b8 = 0.0 - local_f8;
    fStack_b4 = 1.0 - local_108;
    fStack_b0 = 0.0 - fStack_f4;
    fStack_ac = 0.0 - fStack_104;
    fStack_c4 = local_108;
    iVar4 = 0;
    do {
      if (-1 < iVar1) {
        fVar15 = (float)iVar4 / (float)_heightSegments;
        fVar20 = fVar15 * local_b8 + local_c8;
        fVar15 = fVar15 * fStack_b4 + fStack_c4;
        auVar22 = ZEXT812(0);
        if (fVar20 <= 0.0) {
          auVar22._4_8_ = 0;
          auVar22._0_4_ = fVar20;
        }
        local_78._12_4_ = 0;
        local_78._0_12_ = auVar22;
        auVar23 = ZEXT812(0);
        if (0.0 <= fVar20) {
          auVar23._4_8_ = 0;
          auVar23._0_4_ = fVar20;
        }
        local_88._12_4_ = 0;
        local_88._0_12_ = auVar23;
        iVar12 = -(uint)(local_c8 <= fVar20);
        iVar13 = -(uint)(fStack_c4 <= fVar15);
        auVar19._4_4_ = iVar13;
        auVar19._0_4_ = iVar12;
        auVar19._8_4_ = iVar13;
        auVar19._12_4_ = iVar13;
        auVar18._8_8_ = auVar19._8_8_;
        auVar18._4_4_ = iVar12;
        auVar18._0_4_ = iVar12;
        uVar10 = movmskpd((int)uVar8,auVar18);
        local_68[0] = 0.0 < fVar20 | (byte)uVar10;
        bVar9 = (byte)uVar10 >> 1 | 1.0 < fVar15;
        uVar8 = (ulong)CONCAT31((int3)((uint)uVar10 >> 8),bVar9);
        local_130 = -(uint)(fVar20 < 0.0 || fVar20 <= local_f8);
        auVar14 = ZEXT812(0x3f800000);
        if (fVar15 <= 1.0) {
          auVar14._4_8_ = 0;
          auVar14._0_4_ = fVar15;
        }
        uStack_8c = 0;
        _local_98 = auVar14;
        auVar17 = ZEXT812(0x3f800000);
        if (1.0 <= fVar15) {
          auVar17._4_8_ = 0;
          auVar17._0_4_ = fVar15;
        }
        uStack_9c = 0;
        _local_a8 = auVar17;
        local_134 = -(uint)(fVar15 < 1.0 || fVar15 <= local_108);
        uVar7 = 0;
        do {
          fVar15 = local_f8;
          if (1.1920929e-07 <= local_e8) {
            if (local_f8 <= 0.0) {
              fVar15 = (float)local_78._0_4_;
              if ((local_68 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_00212994;
            }
            else {
              fVar15 = (float)local_88._0_4_;
              if ((local_130 & 1) == 0) {
LAB_00212994:
                fVar15 = local_f8;
              }
            }
          }
          local_12c = (float)(int)uVar7;
          fVar20 = local_120 * local_12c;
          fVar16 = cosf(fVar20);
          local_140.x = fVar16 * fVar15;
          local_138 = sinf(fVar20);
          local_138 = local_138 * fVar15;
          fStack_13c = (float)local_48._0_4_;
          local_118.x = local_12c / local_11c;
          local_114 = local_108;
          if (1.1920929e-07 <= local_e8) {
            if (local_108 <= 1.0) {
              local_114 = (float)local_98._0_4_;
              if (bVar9 == 0) goto LAB_00212a4f;
            }
            else {
              local_114 = (float)local_a8._0_4_;
              if ((local_134 & 1) == 0) {
LAB_00212a4f:
                local_114 = local_108;
              }
            }
          }
          local_114 = 1.0 - local_114;
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_118);
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_140);
          Mesh::addNormal(__return_storage_ptr__,&local_d8);
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      bVar11 = iVar4 != _heightSegments;
      iVar4 = iVar4 + 1;
    } while (bVar11);
    if (local_124 == TRIANGLES) {
      if (0 < _heightSegments) {
        iVar4 = 2;
        if (2 < local_128) {
          iVar4 = local_128;
        }
        iVar12 = 0;
        do {
          if (0 < iVar1) {
            uVar6 = (iVar12 + 1) * uVar3 + (int)local_110;
            uVar5 = iVar12 * uVar3 + (int)local_110;
            uVar8 = (ulong)this & 0xffffffff;
            do {
              Mesh::addIndex(__return_storage_ptr__,uVar5);
              uVar5 = uVar5 + 1;
              Mesh::addIndex(__return_storage_ptr__,uVar5);
              Mesh::addIndex(__return_storage_ptr__,uVar6);
              if (iVar12 < _heightSegments + -1) {
                Mesh::addIndex(__return_storage_ptr__,uVar5);
                Mesh::addIndex(__return_storage_ptr__,uVar6 + 1);
                Mesh::addIndex(__return_storage_ptr__,uVar6);
              }
              uVar6 = uVar6 + 1;
              uVar7 = (int)uVar8 - 1;
              uVar8 = (ulong)uVar7;
            } while (uVar7 != 0);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar4 + -1);
      }
    }
    else if (0 < _heightSegments) {
      iVar4 = 2;
      if (2 < local_128) {
        iVar4 = local_128;
      }
      iVar12 = 0;
      do {
        if (-1 < iVar1) {
          uVar5 = iVar12 * uVar3 + (int)local_110;
          uVar6 = (iVar12 + 1) * uVar3 + (int)local_110;
          uVar7 = uVar3;
          do {
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            Mesh::addIndex(__return_storage_ptr__,uVar6);
            uVar5 = uVar5 + 1;
            uVar6 = uVar6 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4 + -1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh cone( float radius, float _height, int _radiusSegments, int _heightSegments, int _capSegments, DrawMode _drawMode ) {
    Mesh mesh;
    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;

    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    _capSegments = _capSegments+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    int capSegs = _capSegments;
    if ( capSegs < 2 )
        capSegs = 0;

    float angleIncRadius = -1.f * ((TAU/((float)_radiusSegments-1.f)));
    float heightInc = _height/((float)_heightSegments-1);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 tcoord;
    glm::vec3 up(0.0,1.0,0.0);

    std::size_t vertOffset = 0;

    float maxTexY = _heightSegments-1.f;
    if (capSegs > 0) 
        maxTexY += capSegs-1.f;

    glm::vec3 startVec(0, -halfH-1.f, 0);

    // cone vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {

            newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.y = heightInc*((float)iy) - halfH;
            vert.z = sin((float)ix*angleIncRadius) * newRad;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - (float)iy/((float)maxTexY);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );

            if (iy == 0) {
                newRad = 1.f;
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.y = heightInc*((float)iy) - halfH;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
            }

            glm::vec3 diff = vert - startVec;
            glm::vec3 crossed = glm::cross(up, vert);
            normal = glm::cross(crossed, diff);
            mesh.addNormal( glm::normalize(normal) );

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                if (y > 0){
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x );
                    mesh.addIndex( (y)*_radiusSegments + x+1 );
                    mesh.addIndex( (y+1)*_radiusSegments + x );
                }

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }
    else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();
    float maxTexYNormalized = (_heightSegments-1.f) / maxTexY;

    // add the cap //
    normal = glm::vec3(0.f, 1.f, 0.f);
    for (int iy = 0; iy < capSegs; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {
            newRad = remap((float)iy, 0, capSegs-1, radius, 0.0, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.z = sin((float)ix*angleIncRadius) * newRad;
            vert.y = halfH;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - remap(iy, 0, capSegs-1, maxTexYNormalized, 1.f, true);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );
        }
    }

    if (_drawMode == TRIANGLES) {
        if ( capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {

                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs-2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        }
    }
    else {
        if (capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }
    }

    return mesh;
}